

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

uint8_t cfd::core::SetPsbtOutput
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *value,
                  wally_psbt_output *output)

{
  char *pcVar1;
  uchar uVar2;
  pointer puVar3;
  uchar *puVar4;
  uchar *value_00;
  CfdException *pCVar5;
  long lVar6;
  ulong uVar7;
  int ret;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  Pubkey pk;
  int local_cc;
  undefined1 local_c8 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  ByteData local_60;
  Pubkey local_48;
  
  puVar3 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  uVar2 = *puVar3;
  if (uVar2 == '\x02') {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_78,lVar6 - 1,(allocator_type *)local_c8);
    if ((long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memcpy(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 1,
             (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
    }
    ByteData::ByteData(&local_60,&local_78);
    Pubkey::Pubkey(&local_48,&local_60);
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Pubkey::GetData((ByteData *)local_c8,&local_48);
    ByteData::GetBytes(&local_90,(ByteData *)local_c8);
    if ((char *)local_c8._0_8_ != (char *)0x0) {
      operator_delete((void *)local_c8._0_8_);
    }
    pcVar1 = local_c8 + 0x10;
    local_c8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"output bip32 pubkey","");
    FindPsbtMap(&output->keypaths,&local_90,(string *)local_c8,(size_t *)0x0);
    if ((char *)local_c8._0_8_ != pcVar1) {
      operator_delete((void *)local_c8._0_8_);
    }
    uVar7 = (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar7 < 4) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x5a6;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,"psbt invalid value format.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt invalid value format error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    uVar7 = uVar7 - 4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_a8,uVar7 >> 2,(allocator_type *)local_c8);
    if (uVar7 != 0) {
      memcpy(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 4,uVar7);
    }
    local_cc = wally_map_add_keypath_item
                         (&output->keypaths,
                          local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_90.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_90.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                          (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                          ._M_impl.super__Vector_impl_data._M_start,4,
                          local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_a8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2);
    if (local_cc != 0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x5b4;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<int&>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,
                        "wally_map_add_keypath_item NG[{}]",&local_cc);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt set output pubkey error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint32_t *)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else if (uVar2 == '\x01') {
    if (lVar6 != 1) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x58b;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = local_c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (output->witness_script != (uchar *)0x0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x590;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,
                    "output witnessScript duplicates.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = local_c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt output witnessScript duplicates error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    puVar4 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_cc = wally_psbt_output_set_witness_script
                         (output,puVar4,
                          (long)(value->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4);
    if (local_cc != 0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x598;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<int&>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,
                        "wally_psbt_output_set_witness_script NG[{}]",&local_cc);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = local_c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt set output witnessScript error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else if (uVar2 == '\0') {
    if (lVar6 != 1) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x578;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = local_c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (output->redeem_script != (uchar *)0x0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x57d;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,
                    "output redeemScript duplicates.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = local_c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt output redeemScript duplicates error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    puVar4 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_cc = wally_psbt_output_set_redeem_script
                         (output,puVar4,
                          (long)(value->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4);
    if (local_cc != 0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x585;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<int&>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,
                        "wally_psbt_output_set_redeem_script NG[{}]",&local_cc);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = local_c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt set output redeemScript error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    pcVar1 = local_c8 + 0x10;
    local_c8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"output unknowns","");
    FindPsbtMap(&output->unknowns,key,(string *)local_c8,(size_t *)0x0);
    if ((char *)local_c8._0_8_ != pcVar1) {
      operator_delete((void *)local_c8._0_8_);
    }
    puVar4 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    value_00 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_cc = wally_map_add(&output->unknowns,puVar4,
                             (long)(key->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4,
                             value_00,(long)(value->
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)value_00);
    if (local_cc != 0) {
      local_c8._0_8_ = "cfdcore_psbt.cpp";
      local_c8._8_4_ = 0x5bd;
      local_c8._16_8_ = "SetPsbtOutput";
      logger::log<int&>((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,"wally_map_add NG[{}]",
                        &local_cc);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"psbt add output unknowns error.","");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_c8);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return *(key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
}

Assistant:

static uint8_t SetPsbtOutput(
    const std::vector<uint8_t> &key, const std::vector<uint8_t> &value,
    struct wally_psbt_output *output) {
  int ret;
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtOutputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->redeem_script != nullptr) {
      warn(CFD_LOG_SOURCE, "output redeemScript duplicates.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt output redeemScript duplicates error.");
    }
    ret = wally_psbt_output_set_redeem_script(
        output, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_output_set_redeem_script NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output redeemScript error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->witness_script != nullptr) {
      warn(CFD_LOG_SOURCE, "output witnessScript duplicates.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt output witnessScript duplicates error.");
    }
    ret = wally_psbt_output_set_witness_script(
        output, value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_output_set_witness_script NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output witnessScript error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    FindPsbtMap(&output->keypaths, pk_bytes, "output bip32 pubkey");

    if (value.size() < 4) {
      warn(CFD_LOG_SOURCE, "psbt invalid value format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid value format error.");
    }
    size_t path_len = value.size() - 4;
    std::vector<uint32_t> path(path_len / 4);
    if (path_len != 0) {
      // TODO(k-matsuzawa) need endian support.
      memcpy(path.data(), &value.data()[4], path_len);
    }
    ret = wally_map_add_keypath_item(
        &output->keypaths, pk_bytes.data(), pk_bytes.size(), value.data(), 4,
        path.data(), path.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add_keypath_item NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set output pubkey error.");
    }
  } else {
    FindPsbtMap(&output->unknowns, key, "output unknowns");
    ret = wally_map_add(
        &output->unknowns, key.data(), key.size(), value.data(), value.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt add output unknowns error.");
    }
  }
  return key[0];
}